

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateOpArrayLength
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  IRContext *pIVar1;
  pointer pOVar2;
  uint32_t uVar3;
  _Type member_idx;
  array<signed_char,_4UL> aVar4;
  Instruction *pIVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  uVar3 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar3 = (uint)inst->has_result_id_;
  }
  uVar3 = Instruction::GetSingleWordOperand(inst,uVar3);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pIVar5 = analysis::DefUseManager::GetDef
                     ((pIVar1->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,uVar3);
  uVar3 = 0;
  if (pIVar5->has_type_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(pIVar5,0);
  }
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pIVar5 = analysis::DefUseManager::GetDef
                     ((pIVar1->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,uVar3);
  uVar7 = (pIVar5->has_result_id_ & 1) + 1;
  if (pIVar5->has_type_id_ == false) {
    uVar7 = (uint)pIVar5->has_result_id_;
  }
  uVar3 = Instruction::GetSingleWordOperand(pIVar5,uVar7 + 1);
  uVar7 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar7 = (uint)inst->has_result_id_;
  }
  member_idx = (_Type)Instruction::GetSingleWordOperand(inst,uVar7 + 1);
  aVar4._M_elems = (_Type)GetNewMemberIndex(this,uVar3,(uint32_t)member_idx);
  if (aVar4._M_elems != (_Type)0xffffffff) {
    if (member_idx != aVar4._M_elems) {
      local_58._24_8_ = local_58 + 0x10;
      local_58._0_8_ = &PTR__SmallVector_009488e0;
      local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_58._8_8_ = 1;
      uVar6 = (ulong)(inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar6 = (ulong)inst->has_result_id_;
      }
      uVar6 = uVar6 + 1;
      pOVar2 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
              -0x5555555555555555;
      local_58._16_4_ = aVar4._M_elems;
      if (uVar8 < uVar6 || uVar8 - uVar6 == 0) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2b8,
                      "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                     );
      }
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
                 (ulong)(uint)((int)uVar6 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_58);
      local_58._0_8_ = &PTR__SmallVector_009488e0;
      if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_38,local_38._M_head_impl);
      }
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        analysis::DefUseManager::UpdateDefUse
                  ((pIVar1->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,inst);
      }
    }
    return member_idx != aVar4._M_elems;
  }
  __assert_fail("new_member_idx != kRemovedMember",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                ,0x2ae,
                "bool spvtools::opt::EliminateDeadMembersPass::UpdateOpArrayLength(Instruction *)");
}

Assistant:

bool EliminateDeadMembersPass::UpdateOpArrayLength(Instruction* inst) {
  uint32_t struct_id = inst->GetSingleWordInOperand(0);
  Instruction* struct_inst = get_def_use_mgr()->GetDef(struct_id);
  uint32_t pointer_type_id = struct_inst->type_id();
  Instruction* pointer_type_inst = get_def_use_mgr()->GetDef(pointer_type_id);
  uint32_t type_id = pointer_type_inst->GetSingleWordInOperand(1);

  uint32_t member_idx = inst->GetSingleWordInOperand(1);
  uint32_t new_member_idx = GetNewMemberIndex(type_id, member_idx);
  assert(new_member_idx != kRemovedMember);

  if (member_idx == new_member_idx) {
    return false;
  }

  inst->SetInOperand(1, {new_member_idx});
  context()->UpdateDefUse(inst);
  return true;
}